

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>,_std::pair<unsigned_short,_unsigned_short>_>
     ::Load(istream *in,
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           *object)

{
  pointer ppVar1;
  size_t i;
  ulong uVar2;
  pair<unsigned_short,_unsigned_short> local_30;
  uint local_2c;
  pair<unsigned_short,_unsigned_short> obj;
  uint32_t size;
  
  std::istream::read((char *)in,(long)&local_2c);
  ppVar1 = (object->
           super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((object->
      super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (object->
    super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  std::
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  ::reserve(object,(ulong)local_2c);
  for (uVar2 = 0; uVar2 < local_2c; uVar2 = uVar2 + 1) {
    local_30.first = 0;
    local_30.second = 0;
    TSerializer<std::pair<unsigned_short,_unsigned_short>,_void>::Load(in,&local_30);
    std::
    vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>
    ::emplace_back<std::pair<unsigned_short,unsigned_short>>
              ((vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>
                *)object,&local_30);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }